

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::tryExpandData
          (Group *this,uint oldLgSize,uint oldOffset,uint expansionFactor)

{
  bool bVar1;
  size_t sVar2;
  DataLocation *location_00;
  DataLocationUsage *this_00;
  Fault local_68;
  Fault f_1;
  Fault local_50;
  Fault f;
  bool result;
  uint localOldOffset;
  DataLocationUsage *usage;
  DataLocation *location;
  uint i;
  bool mustFail;
  uint expansionFactor_local;
  uint oldOffset_local;
  uint oldLgSize_local;
  Group *this_local;
  
  bVar1 = false;
  if ((6 < oldLgSize + expansionFactor) ||
     ((oldOffset & (1 << ((byte)expansionFactor & 0x1f)) - 1U) != 0)) {
    bVar1 = shouldDetectIssue344();
    if (!bVar1) {
      return false;
    }
    bVar1 = true;
  }
  location._4_4_ = 0;
  while( true ) {
    sVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
            size(&this->parentDataLocationUsage);
    if (sVar2 <= location._4_4_) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x238,FAILED,(char *)0x0,"\"Tried to expand field that was never allocated.\"",
                 (char (*) [48])"Tried to expand field that was never allocated.");
      kj::_::Debug::Fault::fatal(&local_68);
    }
    location_00 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
                  operator[](&this->parent->dataLocations,(ulong)location._4_4_);
    if ((oldLgSize <= location_00->lgSize) &&
       (oldOffset >> ((char)location_00->lgSize - (char)oldLgSize & 0x1fU) == location_00->offset))
    break;
    location._4_4_ = location._4_4_ + 1;
  }
  this_00 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
            operator[](&this->parentDataLocationUsage,(ulong)location._4_4_);
  f.exception._4_4_ =
       oldOffset - (location_00->offset << ((char)location_00->lgSize - (char)oldLgSize & 0x1fU));
  f.exception._3_1_ =
       DataLocationUsage::tryExpand
                 (this_00,this,location_00,oldLgSize,f.exception._4_4_,expansionFactor);
  if ((bVar1) && ((bool)f.exception._3_1_)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[177]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x232,FAILED,(char *)0x0,
               "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344\""
               ,(char (*) [177])
                "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344"
              );
    kj::_::Debug::Fault::fatal(&local_50);
  }
  return (bool)f.exception._3_1_;
}

Assistant:

bool tryExpandData(uint oldLgSize, uint oldOffset, uint expansionFactor) override {
      bool mustFail = false;
      if (oldLgSize + expansionFactor > 6 ||
          (oldOffset & ((1 << expansionFactor) - 1)) != 0) {
        // Expansion is not possible because the new size is too large or the offset is not
        // properly-aligned.

        // Unfortunately, Cap'n Proto 0.5.x and prior forgot to "return false" here, instead
        // continuing to execute the rest of the method. In most cases, the method failed later
        // on, causing no harm. But, in cases where the method later succeeded, it probably
        // led to bogus layouts. We cannot simply add the return statement now as this would
        // silently break backwards-compatibility with affected schemas. Instead, we detect the
        // problem and throw an exception.
        //
        // TODO(cleanup): Once sufficient time has elapsed, switch to "return false;" here.
        if (shouldDetectIssue344()) {
          mustFail = true;
        } else {
          return false;
        }
      }

      for (uint i = 0; i < parentDataLocationUsage.size(); i++) {
        auto& location = parent.dataLocations[i];
        if (location.lgSize >= oldLgSize &&
            oldOffset >> (location.lgSize - oldLgSize) == location.offset) {
          // The location we're trying to expand is a subset of this data location.
          auto& usage = parentDataLocationUsage[i];

          // Adjust the offset to be only within this location.
          uint localOldOffset = oldOffset - (location.offset << (location.lgSize - oldLgSize));

          // Try to expand.
          bool result = usage.tryExpand(
              *this, location, oldLgSize, localOldOffset, expansionFactor);
          if (mustFail && result) {
            KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344");
          }
          return result;
        }
      }

      KJ_FAIL_ASSERT("Tried to expand field that was never allocated.");
      return false;
    }